

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O3

void testRgba(string *tempDir)

{
  Rgba *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  unsigned_short uVar9;
  ushort uVar10;
  int iVar11;
  undefined7 extraout_var;
  long *plVar12;
  undefined7 extraout_var_00;
  undefined7 uVar20;
  ulong uVar13;
  Rgba *pRVar14;
  ulong uVar15;
  Compression *pCVar16;
  Rgba *pRVar17;
  Box2i *pBVar18;
  half *phVar19;
  short sVar21;
  half *phVar22;
  int iVar23;
  int x_3;
  uint uVar24;
  long lVar25;
  Array2D<Imf_2_5::Rgba> *p1_00;
  undefined8 in_R9;
  int x;
  RgbaChannels channels;
  long lVar26;
  long lVar27;
  int y;
  long lVar28;
  float fVar29;
  float i;
  float fVar30;
  Compression comp;
  ulong local_180;
  long local_178;
  Rgba *local_170;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_e8;
  string fileName_1;
  RgbaOutputFile out;
  uif x_2;
  uif x_1;
  Rgba *local_68;
  Array2D<Imf_2_5::Rgba> p1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the RGBA image interface",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  p1._sizeX = 0x77;
  p1._sizeY = 0xed;
  p1._data = (Rgba *)operator_new__(0x37158);
  lVar27 = 0;
  lVar28 = 0;
  do {
    dVar4 = (double)(int)lVar28;
    lVar26 = 0;
    do {
      pRVar14 = p1._data;
      lVar25 = p1._sizeY;
      dVar5 = (double)(int)lVar26;
      dVar6 = sin(dVar5 * 0.1 + dVar4 * 0.1);
      fVar29 = (float)(dVar6 * 0.5 + 0.5);
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        if (half::_eLut[(uint)fVar29 >> 0x17] == 0) {
          uVar9 = half::convert((int)fVar29);
        }
        else {
          uVar9 = half::_eLut[(uint)fVar29 >> 0x17] +
                  (short)(((uint)fVar29 & 0x7fffff) + 0xfff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        uVar9 = (unsigned_short)((uint)fVar29 >> 0x10);
      }
      lVar25 = lVar25 * lVar27;
      *(unsigned_short *)((long)&pRVar14[lVar26].r._h + lVar25) = uVar9;
      dVar6 = sin(dVar5 * 0.1 + dVar4 * 0.2);
      fVar29 = (float)(dVar6 * 0.5 + 0.5);
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        if (half::_eLut[(uint)fVar29 >> 0x17] == 0) {
          uVar9 = half::convert((int)fVar29);
        }
        else {
          uVar9 = half::_eLut[(uint)fVar29 >> 0x17] +
                  (short)(((uint)fVar29 & 0x7fffff) + 0xfff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        uVar9 = (unsigned_short)((uint)fVar29 >> 0x10);
      }
      *(unsigned_short *)((long)&pRVar14[lVar26].g._h + lVar25) = uVar9;
      dVar5 = sin(dVar5 * 0.1 + dVar4 * 0.3);
      fVar29 = (float)(dVar5 * 0.5 + 0.5);
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        if (half::_eLut[(uint)fVar29 >> 0x17] == 0) {
          uVar10 = half::convert((int)fVar29);
        }
        else {
          uVar10 = half::_eLut[(uint)fVar29 >> 0x17] +
                   (short)(((uint)fVar29 & 0x7fffff) + 0xfff +
                           (uint)(((uint)fVar29 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      else {
        uVar10 = (ushort)((uint)fVar29 >> 0x10);
      }
      *(ushort *)((long)&pRVar14[lVar26].b._h + lVar25) = uVar10;
      fVar29 = (half::_toFloat[*(unsigned_short *)((long)&pRVar14[lVar26].r._h + lVar25)].f +
                half::_toFloat[uVar10].f +
               half::_toFloat[*(unsigned_short *)((long)&pRVar14[lVar26].g._h + lVar25)].f) / 3.0;
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        if (half::_eLut[(uint)fVar29 >> 0x17] == 0) {
          uVar9 = half::convert((int)fVar29);
        }
        else {
          uVar9 = half::_eLut[(uint)fVar29 >> 0x17] +
                  (short)(((uint)fVar29 & 0x7fffff) + 0xfff + (uint)(((uint)fVar29 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        uVar9 = (unsigned_short)((uint)fVar29 >> 0x10);
      }
      *(unsigned_short *)((long)&pRVar14[lVar26].a._h + lVar25) = uVar9;
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0xed);
    lVar28 = lVar28 + 1;
    lVar27 = lVar27 + 8;
  } while (lVar28 != 0x77);
  IlmThread_2_5::supportsThreads();
  paVar2 = &__str.field_2;
  bVar8 = IlmThread_2_5::supportsThreads();
  uVar20 = extraout_var;
  if (bVar8) {
    Imf_2_5::setGlobalThreadCount(0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
    iVar11 = Imf_2_5::globalThreadCount();
    plVar12 = (long *)std::ostream::operator<<(&std::cout,iVar11);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    uVar20 = extraout_var_00;
  }
  p1_00 = (Array2D<Imf_2_5::Rgba> *)0x0;
  uVar13 = CONCAT71(uVar20,1);
  do {
    channels = 0;
    do {
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      comp = (Compression)uVar13;
      iVar11 = (int)&p1;
      anon_unknown.dwarf_27eb36::writeReadRGBA
                (__str._M_dataplus._M_p,iVar11,0xf,p1_00,channels,(LineOrder)in_R9,comp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      anon_unknown.dwarf_27eb36::writeReadRGBA
                (__str._M_dataplus._M_p,iVar11,7,p1_00,channels,(LineOrder)in_R9,comp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      anon_unknown.dwarf_27eb36::writeReadRGBA
                (__str._M_dataplus._M_p,iVar11,8,p1_00,channels,(LineOrder)in_R9,comp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      anon_unknown.dwarf_27eb36::writeReadRGBA
                (__str._M_dataplus._M_p,iVar11,5,p1_00,channels,(LineOrder)in_R9,comp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      channels = channels + WRITE_R;
    } while (channels != (WRITE_A|WRITE_G));
    p1_00 = (Array2D<Imf_2_5::Rgba> *)0x1;
    uVar15 = uVar13 & 1;
    uVar13 = 0;
  } while (uVar15 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nfile with missing and broken scan lines",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&fileName,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&fileName);
  pRVar14 = (Rgba *)operator_new__(960000);
  uVar13 = 0;
  local_68 = pRVar14;
  do {
    uVar15 = uVar13 & 0xffffffff;
    iVar23 = (int)(uVar15 / 0x17) + (int)(uVar15 / 0x17) * -0x18 + (int)uVar13;
    fVar29 = (float)iVar23;
    iVar11 = (int)uVar13 + (int)(uVar15 / 0x1d) * -2 + (int)(uVar15 / 0x1d) * -0x1b;
    i = (float)iVar11;
    lVar27 = 0;
    do {
      uVar24 = (uint)lVar27 & 0xffff;
      sVar21 = (short)lVar27 + (short)(uVar24 / 5) * -5;
      fVar30 = (float)(int)sVar21;
      if (sVar21 == 0) {
        local_180 = (ulong)((uint)fVar30 >> 0x10);
      }
      else if (half::_eLut[(uint)fVar30 >> 0x17] == 0) {
        uVar10 = half::convert((int)fVar30);
        local_180 = (ulong)uVar10;
      }
      else {
        local_180 = (ulong)((uint)half::_eLut[(uint)fVar30 >> 0x17] +
                           (((uint)fVar30 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar30 >> 0xd & 1) != 0) >> 0xd));
      }
      uVar24 = uVar24 / 0x11;
      sVar21 = (short)lVar27 - ((short)(uVar24 << 4) + (short)uVar24);
      fVar30 = (float)(int)sVar21;
      if (sVar21 == 0) {
        uVar24 = (uint)fVar30 >> 0x10;
      }
      else if (half::_eLut[(uint)fVar30 >> 0x17] == 0) {
        uVar10 = half::convert((int)fVar30);
        uVar24 = (uint)uVar10;
      }
      else {
        uVar24 = (uint)half::_eLut[(uint)fVar30 >> 0x17] +
                 (((uint)fVar30 & 0x7fffff) + 0xfff + (uint)(((uint)fVar30 >> 0xd & 1) != 0) >> 0xd)
        ;
      }
      uVar15 = (ulong)((uint)fVar29 >> 0x10);
      if (iVar23 != 0) {
        if (half::_eLut[(uint)fVar29 >> 0x17] == 0) {
          uVar10 = half::convert((int)fVar29);
          uVar15 = (ulong)uVar10;
        }
        else {
          uVar15 = (ulong)((uint)half::_eLut[(uint)fVar29 >> 0x17] +
                          (((uint)fVar29 & 0x7fffff) + 0xfff +
                           (uint)(((uint)fVar29 >> 0xd & 1) != 0) >> 0xd));
        }
      }
      uVar10 = (ushort)((uint)i >> 0x10);
      if (iVar11 != 0) {
        if (half::_eLut[(uint)i >> 0x17] == 0) {
          uVar10 = half::convert((int)i);
        }
        else {
          uVar10 = half::_eLut[(uint)i >> 0x17] +
                   (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd);
        }
      }
      local_68[lVar27] =
           (Rgba)(local_180 & 0xffff |
                 (ulong)(uVar24 << 0x10) | (uVar15 & 0xffff) << 0x20 | (ulong)uVar10 << 0x30);
      lVar27 = lVar27 + 1;
    } while (lVar27 != 400);
    uVar13 = uVar13 + 1;
    local_68 = local_68 + 400;
  } while (uVar13 != 300);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  remove(fileName._M_dataplus._M_p);
  out._vptr_RgbaOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header((Header *)&__str,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pCVar16 = Imf_2_5::Header::compression((Header *)&__str);
  _Var7 = fileName._M_dataplus;
  *pCVar16 = ZIPS_COMPRESSION;
  iVar11 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile(&out,_Var7._M_p,(Header *)&__str,WRITE_RGBA,iVar11);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,pRVar14,1,400);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x96);
  Imf_2_5::RgbaOutputFile::breakScanLine(&out,10,10,10,-1);
  Imf_2_5::RgbaOutputFile::breakScanLine(&out,0x19,10,10,-1);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  Imf_2_5::Header::~Header((Header *)&__str);
  pRVar17 = (Rgba *)operator_new__(960000);
  local_178 = 0;
  local_170 = pRVar17;
  do {
    lVar27 = 0;
    do {
      pRVar1 = local_170 + lVar27;
      pRVar1->r = 0xbc00;
      pRVar1->g = 0xbc00;
      pRVar1->b = 0xbc00;
      pRVar1->a = 0xbc00;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 400);
    local_178 = local_178 + 1;
    local_170 = local_170 + 400;
  } while (local_178 != 300);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"reading one scan line at a time,",0x20);
  std::ostream::flush();
  _Var7 = fileName._M_dataplus;
  iVar11 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&__str,_Var7._M_p,iVar11);
  pBVar18 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&__str);
  iVar11 = (pBVar18->min).x;
  if ((pBVar18->max).x - iVar11 != 399) {
    __assert_fail("dw.max.x - dw.min.x + 1 == width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x109,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  iVar23 = (pBVar18->min).y;
  if ((pBVar18->max).y - iVar23 != 299) {
    __assert_fail("dw.max.y - dw.min.y + 1 == height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x10a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (iVar11 == 0) {
    if (iVar23 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                    ,0x10c,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::RgbaInputFile::setFrameBuffer((RgbaInputFile *)&__str,pRVar17,1,400);
    uVar24 = 0;
    do {
      Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&__str,uVar24);
      if ((uVar24 == 0x19) || (uVar24 == 10)) {
        __assert_fail("scanLineBroken",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                      ,0x123,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      if (0x95 < uVar24) {
        __assert_fail("scanLinePresent == (y < height / 2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                      ,0x125,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != 300);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::ostream::flush();
    phVar19 = &pRVar17->a;
    phVar22 = &pRVar14->a;
    uVar13 = 0;
    do {
      lVar27 = 0;
      do {
        if (((uVar13 < 0x96) && ((char)uVar13 != '\n')) && (((uint)uVar13 & 0xff) != 0x19)) {
          if (((((half::_toFloat[phVar19[lVar27 * 4 + -3]._h].f !=
                  half::_toFloat[phVar22[lVar27 * 4 + -3]._h].f) ||
                (NAN(half::_toFloat[phVar19[lVar27 * 4 + -3]._h].f) ||
                 NAN(half::_toFloat[phVar22[lVar27 * 4 + -3]._h].f))) ||
               (half::_toFloat[phVar19[lVar27 * 4 + -2]._h].f !=
                half::_toFloat[phVar22[lVar27 * 4 + -2]._h].f)) ||
              ((NAN(half::_toFloat[phVar19[lVar27 * 4 + -2]._h].f) ||
                NAN(half::_toFloat[phVar22[lVar27 * 4 + -2]._h].f) ||
               (half::_toFloat[phVar19[lVar27 * 4 + -1]._h].f !=
                half::_toFloat[phVar22[lVar27 * 4 + -1]._h].f)))) ||
             ((NAN(half::_toFloat[phVar19[lVar27 * 4 + -1]._h].f) ||
               NAN(half::_toFloat[phVar22[lVar27 * 4 + -1]._h].f) ||
              ((half::_toFloat[phVar19[lVar27 * 4]._h].f != half::_toFloat[phVar22[lVar27 * 4]._h].f
               || (NAN(half::_toFloat[phVar19[lVar27 * 4]._h].f) ||
                   NAN(half::_toFloat[phVar22[lVar27 * 4]._h].f))))))) {
            __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                          ,0x136,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else if ((((half::_toFloat[phVar19[lVar27 * 4 + -3]._h].f != -1.0) ||
                  (NAN(half::_toFloat[phVar19[lVar27 * 4 + -3]._h].f))) ||
                 ((half::_toFloat[phVar19[lVar27 * 4 + -2]._h].f != -1.0 ||
                  ((NAN(half::_toFloat[phVar19[lVar27 * 4 + -2]._h].f) ||
                   (half::_toFloat[phVar19[lVar27 * 4 + -1]._h].f != -1.0)))))) ||
                ((NAN(half::_toFloat[phVar19[lVar27 * 4 + -1]._h].f) ||
                 ((half::_toFloat[phVar19[lVar27 * 4]._h].f != -1.0 ||
                  (NAN(half::_toFloat[phVar19[lVar27 * 4]._h].f))))))) {
          __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                        ,0x13d,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 400);
      uVar13 = uVar13 + 1;
      phVar19 = phVar19 + 0x640;
      phVar22 = phVar22 + 0x640;
    } while (uVar13 != 300);
    Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&__str);
    operator_delete__(pRVar17);
    pRVar14 = (Rgba *)operator_new__(960000);
    local_178 = 0;
    local_170 = pRVar14;
    do {
      local_e8 = 0;
      do {
        pRVar17 = local_170 + local_e8;
        pRVar17->r = 0xbc00;
        pRVar17->g = 0xbc00;
        pRVar17->b = 0xbc00;
        pRVar17->a = 0xbc00;
        local_e8 = local_e8 + 1;
      } while (local_e8 != 400);
      local_178 = local_178 + 1;
      local_170 = local_170 + 400;
    } while (local_178 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading multiple scan lines at a time,",0x26);
    std::ostream::flush();
    _Var7 = fileName._M_dataplus;
    iVar11 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&__str,_Var7._M_p,iVar11);
    pBVar18 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&__str);
    iVar11 = (pBVar18->min).x;
    if ((pBVar18->max).x - iVar11 == 399) {
      iVar23 = (pBVar18->min).y;
      if ((pBVar18->max).y - iVar23 != 299) {
        __assert_fail("dw.max.y - dw.min.y + 1 == height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                      ,0x150,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      if (iVar11 == 0) {
        if (iVar23 == 0) {
          Imf_2_5::RgbaInputFile::setFrameBuffer((RgbaInputFile *)&__str,pRVar14,1,400);
          Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&__str,0,299);
          __assert_fail("scanLinesMissing || scanLinesBroken",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                        ,0x166,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        __assert_fail("dw.min.y == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                      ,0x152,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                    ,0x151,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    __assert_fail("dw.max.x - dw.min.x + 1 == width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                  ,0x14f,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  __assert_fail("dw.min.x == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                ,0x10b,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testRgba (const std::string &tempDir)
{
    try
    {
	cout << "Testing the RGBA image interface" << endl;

	rgbaMethods ();

	const int W = 237;
	const int H = 119;

	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
	    {
		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGBA,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGB,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_A,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   RgbaChannels (WRITE_R | WRITE_B),
				   LineOrder (lorder),
				   Compression (comp));
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}